

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O2

int AF_A_FireCGun(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  short sVar2;
  DObject *this;
  player_t *this_00;
  AWeapon *this_01;
  bool bVar3;
  bool bVar4;
  void *pvVar5;
  FState *flashstate;
  FState *pFVar6;
  DPSprite *pDVar7;
  PClassActor *pufftype;
  AActor *ent;
  char *__assertion;
  FName local_44;
  FName local_40;
  FSoundID local_3c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00521258;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00521236;
  ent = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_0052105c;
    bVar3 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00521258;
    }
    bVar3 = false;
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_00521236;
LAB_0052105c:
    bVar3 = true;
    ent = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_00521236:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_00521258;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar4 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar4)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00521258;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_00521236;
    }
    if ((2 < (uint)numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
      if (VVar1 == '\x03') {
        pvVar5 = param[2].field_0.field_1.a;
        if (param[2].field_0.field_1.atag == 8) goto LAB_005210e3;
        if (pvVar5 == (void *)0x0) goto LAB_005210e1;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_00521258:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x19e,"int AF_A_FireCGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_005210e1:
  pvVar5 = (void *)0x0;
LAB_005210e3:
  if ((!bVar3) && (this_00 = ent->player, this_00 != (player_t *)0x0)) {
    this_01 = this_00->ReadyWeapon;
    if ((pvVar5 != (void *)0x0 && this_01 != (AWeapon *)0x0) && (*(int *)((long)pvVar5 + 8) == 1)) {
      bVar3 = AWeapon::DepleteAmmo(this_01,this_01->bAltFire,true,1);
      if (!bVar3) {
        return 0;
      }
      local_3c.ID = S_FindSound("weapons/chngun");
      S_Sound(ent,1,&local_3c,1.0,1.0);
      local_40.Index = 0xa3;
      flashstate = AActor::FindState((AActor *)this_01,&local_40);
      if (flashstate != (FState *)0x0) {
        local_44.Index = 0x9f;
        pFVar6 = AActor::FindState((AActor *)this_01,&local_44);
        pDVar7 = player_t::GetPSprite(this_00,PSP_WEAPON);
        bVar3 = 0 < (int)(((long)pDVar7->State - (long)pFVar6) / 0x28);
        P_SetSafeFlash(this_01,this_00,flashstate,
                       (uint)(bVar3 && flashstate[bVar3].sprite == flashstate->sprite));
      }
    }
    APlayerPawn::PlayAttacking2(this_00->mo);
    sVar2 = this_00->refire;
    pufftype = PClass::FindActor(NAME_BulletPuff);
    P_BulletSlope((AActor *)&stack0xffffffffffffffc8,(FTranslatedLineTarget *)ent,0);
    P_GunShot(ent,sVar2 == 0,pufftype,(DAngle *)&stack0xffffffffffffffc8);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireCGun)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (self == nullptr || nullptr == (player = self->player))
	{
		return 0;
	}

	AWeapon *weapon = player->ReadyWeapon;
	if (weapon != nullptr && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
			return 0;
		
		S_Sound (self, CHAN_WEAPON, "weapons/chngun", 1, ATTN_NORM);

		FState *flash = weapon->FindState(NAME_Flash);
		if (flash != nullptr)
		{
			// [RH] Fix for Sparky's messed-up Dehacked patch! Blargh!
			FState * atk = weapon->FindState(NAME_Fire);

			int theflash = clamp (int(player->GetPSprite(PSP_WEAPON)->GetState() - atk), 0, 1);

			if (flash[theflash].sprite != flash->sprite)
			{
				theflash = 0;
			}

			P_SetSafeFlash (weapon, player, flash, theflash);
		}

	}
	player->mo->PlayAttacking2 ();

	P_GunShot (self, !player->refire, PClass::FindActor(NAME_BulletPuff), P_BulletSlope (self));
	return 0;
}